

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O1

TValue * lj_tab_newkey(lua_State *L,GCtab *t,cTValue *key)

{
  TValue *pTVar1;
  uint64_t uVar2;
  bool bVar3;
  MRef MVar4;
  TValue *pTVar5;
  MRef MVar6;
  TValue *pTVar7;
  GCobj *o;
  MRef MVar8;
  TValue *pTVar9;
  TValue *pTVar10;
  MRef MVar11;
  
  pTVar5 = &hashkey(t,key)->val;
  if ((pTVar5->u64 != 0xffffffffffffffff) || (t->hmask == 0)) {
    pTVar1 = (TValue *)(t->node).ptr64;
    MVar8.ptr64 = (t->freetop).ptr64;
    pTVar10 = (TValue *)MVar8.ptr64;
    do {
      pTVar9 = pTVar10;
      if (pTVar9 == pTVar1) {
        rehashtab(L,t,key);
        MVar6.ptr64 = (uint64_t)lj_tab_set(L,t,key);
        goto LAB_00129879;
      }
      pTVar10 = pTVar9 + -3;
      MVar8.ptr64 = MVar8.ptr64 + -0x18;
    } while (pTVar9[-2].u64 != 0xffffffffffffffff);
    (t->freetop).ptr64 = MVar8.ptr64;
    MVar6.ptr64 = (uint64_t)hashkey(t,pTVar5 + 1);
    if ((TValue *)MVar6.ptr64 == pTVar5) {
      MVar6.ptr64 = pTVar5[2].u64;
      pTVar9[-1].u64 = MVar6.ptr64;
      pTVar5[2].u64 = MVar8.ptr64;
      pTVar5 = pTVar10;
    }
    else {
      do {
        pTVar7 = (TValue *)MVar6.ptr64;
        MVar6.ptr64 = pTVar7[2].u64;
      } while (pTVar5 != (TValue *)MVar6.ptr64);
      pTVar7[2].u64 = MVar8.ptr64;
      (((TValue *)&(pTVar10->gcr).gcptr64)->gcr).gcptr64 = ((uint64_t)*(GCRef *)pTVar5).gcptr64;
      pTVar9[-2] = pTVar5[1];
      MVar6.ptr64 = pTVar5[2].u64;
      pTVar9[-1].u64 = MVar6.ptr64;
      pTVar5[2].u64 = 0;
      pTVar5->u64 = 0xffffffffffffffff;
      do {
        MVar8.ptr64 = pTVar10[2].u64;
        if ((long *)MVar8.ptr64 == (long *)0x0) break;
        bVar3 = true;
        if ((*(long *)MVar8.ptr64 != -1) &&
           (MVar6.ptr64 = (uint64_t)hashkey(t,(cTValue *)(MVar8.ptr64 + 8)),
           (TValue *)MVar6.ptr64 == pTVar5)) {
          pTVar10[2] = *(TValue *)(MVar8.ptr64 + 0x10);
          MVar6.ptr64 = pTVar5[2].u64;
          *(uint64_t *)(MVar8.ptr64 + 0x10) = MVar6.ptr64;
          pTVar5[2].u64 = MVar8.ptr64;
          MVar4.ptr64 = pTVar10[2].u64;
          MVar8.ptr64 = (uint64_t)pTVar10;
          while (MVar11.ptr64 = MVar4.ptr64, (Node *)MVar11.ptr64 != (Node *)0x0) {
            if ((*(long *)MVar11.ptr64 != -1) &&
               (MVar6.ptr64 = (uint64_t)hashkey(t,(cTValue *)(MVar11.ptr64 + 8)),
               MVar6.ptr64 != MVar11.ptr64 && MVar6.ptr64 != MVar8.ptr64)) {
              *(uint64_t *)(MVar8.ptr64 + 0x10) = ((MRef *)(MVar11.ptr64 + 0x10))->ptr64;
              ((MRef *)(MVar11.ptr64 + 0x10))->ptr64 = (uint64_t)*(TValue *)(MVar6.ptr64 + 0x10);
              ((TValue *)(MVar6.ptr64 + 0x10))->u64 = MVar11.ptr64;
              MVar11.ptr64 = MVar8.ptr64;
            }
            MVar8.ptr64 = MVar11.ptr64;
            MVar4.ptr64 = ((TValue *)(MVar11.ptr64 + 0x10))->u64;
          }
          bVar3 = false;
        }
        pTVar10 = (TValue *)MVar8.ptr64;
      } while (bVar3);
    }
LAB_00129879:
    if (pTVar9 == pTVar1) {
      return (TValue *)MVar6.ptr64;
    }
  }
  pTVar5[1] = *key;
  if ((t->marked & 4) != 0) {
    uVar2 = (L->glref).ptr64;
    t->marked = t->marked & 0xfb;
    (t->gclist).gcptr64 = *(uint64_t *)(uVar2 + 0x40);
    *(GCtab **)(uVar2 + 0x40) = t;
  }
  return pTVar5;
}

Assistant:

TValue *lj_tab_newkey(lua_State *L, GCtab *t, cTValue *key)
{
  Node *n = hashkey(t, key);
  if (!tvisnil(&n->val) || t->hmask == 0) {
    Node *nodebase = noderef(t->node);
    Node *collide, *freenode = getfreetop(t, nodebase);
    lj_assertL(freenode >= nodebase && freenode <= nodebase+t->hmask+1,
	       "bad freenode");
    do {
      if (freenode == nodebase) {  /* No free node found? */
	rehashtab(L, t, key);  /* Rehash table. */
	return lj_tab_set(L, t, key);  /* Retry key insertion. */
      }
    } while (!tvisnil(&(--freenode)->key));
    setfreetop(t, nodebase, freenode);
    lj_assertL(freenode != &G(L)->nilnode, "store to fallback hash");
    collide = hashkey(t, &n->key);
    if (collide != n) {  /* Colliding node not the main node? */
      while (noderef(collide->next) != n)  /* Find predecessor. */
	collide = nextnode(collide);
      setmref(collide->next, freenode);  /* Relink chain. */
      /* Copy colliding node into free node and free main node. */
      freenode->val = n->val;
      freenode->key = n->key;
      freenode->next = n->next;
      setmref(n->next, NULL);
      setnilV(&n->val);
      /* Rechain pseudo-resurrected string keys with colliding hashes. */
      while (nextnode(freenode)) {
	Node *nn = nextnode(freenode);
	if (!tvisnil(&nn->val) && hashkey(t, &nn->key) == n) {
	  freenode->next = nn->next;
	  nn->next = n->next;
	  setmref(n->next, nn);
	  /*
	  ** Rechaining a resurrected string key creates a new dilemma:
	  ** Another string key may have originally been resurrected via
	  ** _any_ of the previous nodes as a chain anchor. Including
	  ** a node that had to be moved, which makes them unreachable.
	  ** It's not feasible to check for all previous nodes, so rechain
	  ** any string key that's currently in a non-main positions.
	  */
	  while ((nn = nextnode(freenode))) {
	    if (!tvisnil(&nn->val)) {
	      Node *mn = hashkey(t, &nn->key);
	      if (mn != freenode && mn != nn) {
		freenode->next = nn->next;
		nn->next = mn->next;
		setmref(mn->next, nn);
	      } else {
		freenode = nn;
	      }
	    } else {
	      freenode = nn;
	    }
	  }
	  break;
	} else {
	  freenode = nn;
	}
      }
    } else {  /* Otherwise use free node. */
      setmrefr(freenode->next, n->next);  /* Insert into chain. */
      setmref(n->next, freenode);
      n = freenode;
    }
  }
  n->key.u64 = key->u64;
  if (LJ_UNLIKELY(tvismzero(&n->key)))
    n->key.u64 = 0;
  lj_gc_anybarriert(L, t);
  lj_assertL(tvisnil(&n->val), "new hash slot is not empty");
  return &n->val;
}